

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t parser_parse_responseline(http_parser_t *parser)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  bool bVar4;
  char *local_58;
  char *p;
  size_t n;
  int i;
  int num_scanned;
  char save_char;
  memptr line;
  http_message_t *hmsg;
  parse_status_t status;
  http_parser_t *parser_local;
  
  line.length = (size_t)parser;
  if (parser->position != POS_RESPONSE_LINE) {
    __assert_fail("parser->position == POS_RESPONSE_LINE",".upnp/src/genlib/net/http/httpparser.c",
                  0x56d,"parse_status_t parser_parse_responseline(http_parser_t *)");
  }
  parser_local._4_4_ = skip_blank_lines(&parser->scanner);
  if ((parser_local._4_4_ == PARSE_OK) &&
     (parser_local._4_4_ = match(&parser->scanner,"%ihttp%w/%w%L%c",&num_scanned),
     parser_local._4_4_ == PARSE_OK)) {
    cVar1 = _num_scanned[(long)line.buf];
    _num_scanned[(long)line.buf] = '\0';
    iVar2 = __isoc99_sscanf(_num_scanned,"%d . %d %d",line.length + 0x10c,line.length + 0x110,
                            line.length + 0xdc);
    _num_scanned[(long)line.buf] = cVar1;
    if ((iVar2 == 3) &&
       (((-1 < *(int *)(line.length + 0x10c) && (-1 < *(int *)(line.length + 0x110))) &&
        (-1 < *(int *)(line.length + 0xdc))))) {
      local_58 = _num_scanned;
      for (n._4_4_ = 0; n._4_4_ < 3; n._4_4_ = n._4_4_ + 1) {
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*local_58] & 0x800) == 0) {
          local_58 = local_58 + 1;
        }
        while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*local_58] & 0x800) != 0) {
          local_58 = local_58 + 1;
        }
      }
      if ((*local_58 == ' ') || (*local_58 == '\t')) {
        while( true ) {
          bVar4 = true;
          if (*local_58 != ' ') {
            bVar4 = *local_58 == '\t';
          }
          if (!bVar4) break;
          local_58 = local_58 + 1;
        }
        iVar2 = membuffer_assign((membuffer *)(line.length + 0xe0),local_58,
                                 (long)line.buf - ((long)local_58 - (long)_num_scanned));
        if (iVar2 == 0) {
          parser->position = POS_HEADERS;
          parser_local._4_4_ = PARSE_OK;
        }
        else {
          parser->http_error_code = 500;
          parser_local._4_4_ = PARSE_FAILURE;
        }
      }
      else {
        parser_local._4_4_ = PARSE_FAILURE;
      }
    }
    else {
      parser_local._4_4_ = PARSE_FAILURE;
    }
  }
  return parser_local._4_4_;
}

Assistant:

parse_status_t parser_parse_responseline(http_parser_t *parser)
{
	parse_status_t status;
	http_message_t *hmsg = &parser->msg;
	memptr line;
	char save_char;
	int num_scanned;
	int i;
	size_t n;
	char *p;

	assert(parser->position == POS_RESPONSE_LINE);

	status = skip_blank_lines(&parser->scanner);
	if (status != (parse_status_t)PARSE_OK)
		return status;
	/* response line */
	/*status = match( &parser->scanner, "%ihttp%w/%w%d\t.\t%d\t%d\t%L%c", */
	/*  &hmsg->major_version, &hmsg->minor_version, */
	/*  &hmsg->status_code, &hmsg->status_msg ); */
	status = match(&parser->scanner, "%ihttp%w/%w%L%c", &line);
	if (status != (parse_status_t)PARSE_OK)
		return status;
	save_char = line.buf[line.length];
	line.buf[line.length] = '\0'; /* null-terminate */
				      /* scan http version and ret code */
#ifdef _WIN32
	num_scanned = sscanf_s(line.buf,
#else
	num_scanned = sscanf(line.buf,
#endif
		"%d . %d %d",
		&hmsg->major_version,
		&hmsg->minor_version,
		&hmsg->status_code);
	line.buf[line.length] = save_char; /* restore */
	if (num_scanned != 3 || hmsg->major_version < 0 ||
		hmsg->minor_version < 0 || hmsg->status_code < 0)
		/* bad response line */
		return PARSE_FAILURE;
	/* point to status msg */
	p = line.buf;
	/* skip 3 ints */
	for (i = 0; i < 3; i++) {
		/* go to start of num */
		while (!isdigit(*p))
			p++;
		/* skip int */
		while (isdigit(*p))
			p++;
	}
	/* whitespace must exist after status code */
	if (*p != ' ' && *p != '\t')
		return PARSE_FAILURE;
	/* skip whitespace */
	while (*p == ' ' || *p == '\t')
		p++;
	/* now, p is at start of status msg */
	n = line.length - ((size_t)p - (size_t)line.buf);
	if (membuffer_assign(&hmsg->status_msg, p, n) != 0) {
		/* out of mem */
		parser->http_error_code = HTTP_INTERNAL_SERVER_ERROR;
		return PARSE_FAILURE;
	}
	parser->position = POS_HEADERS; /* move to headers */

	return PARSE_OK;
}